

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

Message * __thiscall
google::protobuf::Reflection::GetRepeatedMessage
          (Reflection *this,Message *message,FieldDescriptor *field,int index)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  Descriptor *pDVar4;
  undefined4 in_ECX;
  FieldDescriptor *in_RDX;
  Reflection *in_RSI;
  Reflection *in_RDI;
  char *in_stack_00000058;
  char *in_stack_00000060;
  undefined4 in_stack_00000068;
  CppType in_stack_0000006c;
  Descriptor *in_stack_00000070;
  undefined4 in_stack_00000078;
  int in_stack_0000007c;
  RepeatedPtrFieldBase *in_stack_00000080;
  int in_stack_000000d8;
  int in_stack_000000dc;
  ExtensionSet *in_stack_000000e0;
  Message *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  MessageLite *local_8;
  
  pDVar4 = FieldDescriptor::containing_type(in_RDX);
  if (pDVar4 != in_RDI->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000070,(FieldDescriptor *)CONCAT44(in_stack_0000006c,in_stack_00000068),
               in_stack_00000060,in_stack_00000058);
  }
  LVar2 = FieldDescriptor::label(in_RDX);
  if (LVar2 != LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000070,(FieldDescriptor *)CONCAT44(in_stack_0000006c,in_stack_00000068),
               in_stack_00000060,in_stack_00000058);
  }
  CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x42b88e);
  if (CVar3 != CPPTYPE_MESSAGE) {
    anon_unknown_0::ReportReflectionUsageTypeError
              ((Descriptor *)in_stack_00000080,
               (FieldDescriptor *)CONCAT44(in_stack_0000007c,in_stack_00000078),
               (char *)in_stack_00000070,in_stack_0000006c);
  }
  bVar1 = FieldDescriptor::is_extension(in_RDX);
  if (bVar1) {
    GetExtensionSet(in_RDI,in_stack_ffffffffffffffc8);
    FieldDescriptor::number(in_RDX);
    local_8 = internal::ExtensionSet::GetRepeatedMessage
                        (in_stack_000000e0,in_stack_000000dc,in_stack_000000d8);
  }
  else {
    bVar1 = anon_unknown_0::IsMapFieldInApi((FieldDescriptor *)0x42b8fe);
    if (bVar1) {
      GetRaw<google::protobuf::internal::MapFieldBase>
                (in_RSI,(Message *)in_RDX,
                 (FieldDescriptor *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8));
      internal::MapFieldBase::GetRepeatedField((MapFieldBase *)in_RDI);
      local_8 = &internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                           (in_stack_00000080,in_stack_0000007c)->super_MessageLite;
    }
    else {
      GetRaw<google::protobuf::internal::RepeatedPtrFieldBase>
                (in_RSI,(Message *)in_RDX,
                 (FieldDescriptor *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8));
      local_8 = &internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                           (in_stack_00000080,in_stack_0000007c)->super_MessageLite;
    }
  }
  return (Message *)local_8;
}

Assistant:

const Message& Reflection::GetRepeatedMessage(const Message& message,
                                              const FieldDescriptor* field,
                                              int index) const {
  USAGE_CHECK_ALL(GetRepeatedMessage, REPEATED, MESSAGE);

  if (field->is_extension()) {
    return static_cast<const Message&>(
        GetExtensionSet(message).GetRepeatedMessage(field->number(), index));
  } else {
    if (IsMapFieldInApi(field)) {
      return GetRaw<MapFieldBase>(message, field)
          .GetRepeatedField()
          .Get<GenericTypeHandler<Message> >(index);
    } else {
      return GetRaw<RepeatedPtrFieldBase>(message, field)
          .Get<GenericTypeHandler<Message> >(index);
    }
  }
}